

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  undefined4 uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  nk_rect bounds;
  nk_rect nVar9;
  nk_rect cursor;
  nk_rect empty_north;
  nk_rect empty_south;
  float local_e0;
  nk_rect local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  nk_rect local_78;
  nk_rect local_60;
  nk_rect local_50;
  nk_rect local_40;
  
  local_c8 = scroll;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35f9,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_scrollbar *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35fa,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x35fb,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  local_c8.w = scroll.w;
  local_50.w = 1.0;
  if (1.0 <= local_c8.w) {
    local_50.w = local_c8.w;
  }
  local_c8.h = scroll.h;
  local_c8._0_8_ = scroll._0_8_;
  uVar2 = local_c8._0_8_;
  local_c8.w = local_50.w;
  fVar8 = local_50.w + local_50.w;
  fVar7 = fVar8;
  if (fVar8 <= local_c8.h) {
    fVar7 = local_c8.h;
  }
  local_c8.h = fVar7;
  nVar9 = local_c8;
  fVar6 = 0.0;
  if (fVar7 < target) {
    if (style->show_buttons != 0) {
      local_98 = ZEXT416((uint)fVar8);
      local_a8 = ZEXT416((uint)fVar7);
      fVar7 = step;
      if (button_pixel_inc <= step) {
        fVar7 = button_pixel_inc;
      }
      local_c8.y = scroll.y;
      fVar8 = local_c8.y;
      local_b8 = ZEXT416((uint)local_50.w);
      local_c8.x = (float)uVar2;
      local_c8.y = SUB84(uVar2,4);
      local_78.x = local_c8.x;
      local_78.y = local_c8.y;
      local_78.w = local_c8.w;
      local_78.h = local_c8.h;
      bounds.h = local_50.w;
      bounds.w = local_50.w;
      local_c8.x = (float)uVar2;
      local_c8.y = SUB84(uVar2,4);
      bounds.x = local_c8.x;
      bounds.y = local_c8.y;
      local_c8 = nVar9;
      local_88 = local_50.w;
      fStack_84 = local_50.w;
      fStack_80 = local_50.w;
      fStack_7c = local_50.w;
      iVar5 = nk_do_button_symbol((nk_flags *)&local_50,out,bounds,style->dec_symbol,
                                  NK_BUTTON_REPEATER,&style->dec_button,in,font);
      local_e0 = offset;
      if (iVar5 != 0) {
        local_e0 = offset - fVar7;
      }
      uVar4 = local_a8._0_4_;
      local_a8._0_4_ = (float)local_a8._0_4_ - (float)local_98._0_4_;
      nVar9.h = fStack_84;
      nVar9.w = local_88;
      nVar9.y = ((float)uVar4 + fVar8) - (float)local_b8._0_4_;
      nVar9.x = local_78.x;
      iVar5 = nk_do_button_symbol((nk_flags *)&local_50,out,nVar9,style->inc_symbol,
                                  NK_BUTTON_REPEATER,&style->inc_button,in,font);
      if (iVar5 != 0) {
        local_e0 = local_e0 + fVar7;
      }
      local_c8.y = fVar8 + (float)local_b8._0_4_;
      local_c8.h = (float)local_a8._0_4_;
      offset = local_e0;
      local_50.w = (float)local_b8._0_4_;
    }
    fVar7 = local_c8.h;
    if (local_c8.h <= step) {
      step = local_c8.h;
    }
    if (target - local_c8.h <= offset) {
      offset = target - local_c8.h;
    }
    fVar8 = 0.0;
    if (0.0 <= offset) {
      fVar8 = offset;
    }
    fVar6 = style->border;
    fVar1 = (style->padding).y;
    fVar3 = local_c8.y;
    local_60.y = (fVar8 / target) * local_c8.h + local_c8.y + fVar6 + fVar1;
    local_60.h = (local_c8.h / target) * local_c8.h - (fVar1 + fVar1 + fVar6 + fVar6);
    fVar1 = (style->padding).x;
    local_60.x = fVar6 + local_c8.x + fVar1;
    local_60.w = local_50.w - (fVar1 + fVar1 + fVar6 + fVar6);
    local_50.x = local_c8.x;
    local_50.y = local_c8.y;
    local_40.y = local_60.h + local_60.y;
    local_50.h = local_60.y - local_c8.y;
    local_40.x = local_c8.x;
    local_40.h = (local_c8.h + local_c8.y) - local_40.y;
    local_40.w = local_50.w;
    fVar8 = nk_scrollbar_behavior
                      (state,in,has_scrolling,&local_c8,&local_60,&local_50,&local_40,fVar8,target,
                       step,NK_VERTICAL);
    local_b8._0_4_ = fVar8;
    local_60.y = (fVar8 / target) * fVar7 + fVar3 + style->border_cursor + (style->padding).y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_scrollbar(out,*state,style,&local_c8,&local_60);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
    fVar6 = (float)local_b8._0_4_;
  }
  return fVar6;
}

Assistant:

NK_INTERN float
nk_do_scrollbarv(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect empty_north;
    struct nk_rect empty_south;
    struct nk_rect cursor;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    NK_ASSERT(state);
    if (!out || !style) return 0;

    scroll.w = NK_MAX(scroll.w, 1);
    scroll.h = NK_MAX(scroll.h, 2 * scroll.w);
    if (target <= scroll.h) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_h;
        struct nk_rect button;

        button.x = scroll.x;
        button.w = scroll.w;
        button.h = scroll.w;

        scroll_h = scroll.h - 2 * button.h;
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.y = scroll.y;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.y = scroll.y + scroll.h - button.h;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.y = scroll.y + button.h;
        scroll.h = scroll_h;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.h);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
    scroll_ratio = scroll.h / target;
    scroll_off = scroll_offset / target;

    /* calculate scrollbar cursor bounds */
    cursor.h = (scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y);
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
    cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
    cursor.x = scroll.x + style->border + style->padding.x;

    /* calculate empty space around cursor */
    empty_north.x = scroll.x;
    empty_north.y = scroll.y;
    empty_north.w = scroll.w;
    empty_north.h = cursor.y - scroll.y;

    empty_south.x = scroll.x;
    empty_south.y = cursor.y + cursor.h;
    empty_south.w = scroll.w;
    empty_south.h = (scroll.y + scroll.h) - (cursor.y + cursor.h);

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
    scroll_off = scroll_offset / target;
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}